

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixin_inheritance.cpp
# Opt level: O0

string * __thiscall
TransparentShape<ColoredShape<Circle>>::str_abi_cxx11_
          (string *__return_storage_ptr__,TransparentShape<ColoredShape<Circle>> *this)

{
  string local_a8;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  TransparentShape<ColoredShape<Circle>> *local_18;
  TransparentShape<ColoredShape<Circle>_> *this_local;
  
  local_18 = this;
  this_local = (TransparentShape<ColoredShape<Circle>_> *)__return_storage_ptr__;
  ColoredShape<Circle>::str_abi_cxx11_(&local_78,(ColoredShape<Circle> *)this);
  std::operator+(&local_58,&local_78," with transparency ");
  std::__cxx11::to_string(&local_a8,((float)(byte)this[0x10] / 255.0) * 100.0);
  std::operator+(&local_38,&local_58,&local_a8);
  std::operator+(__return_storage_ptr__,&local_38,'%');
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const override
	{
		return T::str() + " with transparency " + std::to_string(transparency / 255.0f * 100) + '%';
	}